

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

bool __thiscall iDynTree::Model::isLinkNameUsed(Model *this,string *linkName)

{
  long lVar1;
  size_t __n;
  int iVar2;
  long lVar3;
  ulong uVar4;
  size_type *psVar5;
  ulong uVar6;
  bool bVar7;
  
  lVar3 = (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                _M_impl.super__Vector_impl_data._M_start;
  bVar7 = lVar3 != 0;
  if (bVar7) {
    lVar3 = lVar3 >> 4;
    uVar4 = lVar3 * 0x6db6db6db6db6db7;
    __n = linkName->_M_string_length;
    psVar5 = &((this->linkNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    uVar6 = 1;
    do {
      if (__n == *psVar5) {
        if (__n == 0) {
          return bVar7;
        }
        iVar2 = bcmp((linkName->_M_dataplus)._M_p,
                     (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar5 + -1))->_M_dataplus)._M_p,__n);
        if (iVar2 == 0) {
          return bVar7;
        }
      }
      bVar7 = uVar6 < uVar4;
      lVar1 = uVar6 + (lVar3 * -0x6db6db6db6db6db7 - (ulong)(uVar4 == 0));
      uVar6 = uVar6 + 1;
      psVar5 = psVar5 + 4;
    } while (lVar1 != 0);
  }
  return bVar7;
}

Assistant:

bool Model::isLinkNameUsed(const std::string linkName) const
{
    for(size_t i=0; i < this->getNrOfLinks(); i++ )
    {
        if( linkName == linkNames[i] )
        {
            return true;
        }
    }

    return false;
}